

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ostream * operator<<(ostream *out,lexemtype *t)

{
  uint uVar1;
  ostream *poVar2;
  
  uVar1 = *t - OBRA;
  if ((uVar1 < 0x19) && ((0x11fffffU >> (uVar1 & 0x1f) & 1) != 0)) {
    poVar2 = std::operator<<(out,&DAT_0010a3e4 + *(int *)(&DAT_0010a3e4 + (ulong)uVar1 * 4));
    return poVar2;
  }
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const lexemtype &t) {
    switch (t) {
        case OBRA:
            return (out << "Open brace");
        case CBRA:
            return (out << "Close brace");
        case OPAR:
            return (out << "Open parenthesis");
        case CPAR:
            return (out << "Close parenthesis");
        case SEMICOLON:
            return (out << "Semicolon operator");
        case INTKW:
            return (out << "Int keyword");
        case RETURNKW:
            return (out << "Return keyword");
        case IFKW:
            return (out << "If keyword");
        case ELSEKW:
            return (out << "Else keyword");
        case IDENTIFIER:
            return (out << "Identifier");
        case INTLITERAL:
            return (out << "Int literal");
        case null:
            break;
        case FORKW:
            return (out << "For keyword");
        case WHILEKW:
            return (out << "While keyword");
        case EQUAL:
            return (out << "Equal sign");
        case LESS:
            return (out << "Less sign");
        case MORE:
            return (out << "More sign");
        case PLUS:
            return (out << "Plus sign");
        case MINUS:
            return (out << "Minus sign");
        case MULTIPLICATION:
            return (out << "Multiplication sign");
        case DIVISION:
            return (out << "Division sign");
        case LOGIC_NEG:
            return (out << "Logic negation sign");
//        case DOUBLEKW:
//            break;
//        case CHARKW:
//            break;
//        case FLOATKW:
//            break;
        case COMMA:
            return (out << "Comma sign");
    }
    return (out);
}